

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::ErrorsUtilities::CheckErrorAndLog
          (ErrorsUtilities *this,Context *context,GLuint expected_error,GLchar *function_name,
          GLchar *log)

{
  ostringstream *this_00;
  int iVar1;
  GLuint GVar2;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1a8._0_8_ = context->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,function_name);
    std::operator<<((ostream *)this_00," generated error ");
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," but, ");
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," was expected if ");
    std::operator<<((ostream *)this_00,log);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return GVar2 == expected_error;
}

Assistant:

bool ErrorsUtilities::CheckErrorAndLog(deqp::Context& context, glw::GLuint expected_error,
									   const glw::GLchar* function_name, const glw::GLchar* log)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Check error. */
	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << function_name << " generated error "
										  << glu::getErrorStr(error) << " but, " << glu::getErrorStr(expected_error)
										  << " was expected if " << log << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}